

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

void __thiscall NavierStokesBase::post_restart(NavierStokesBase *this)

{
  int iVar1;
  pointer pSVar2;
  Real time;
  Real RVar3;
  ostream *os_;
  StateDescriptor *d;
  long lVar4;
  size_type __new_size;
  Vector<char,_std::allocator<char>_> fileCharPtr;
  string fileCharPtrString;
  string File;
  string file;
  string line;
  istringstream isp;
  ostream local_1a0 [376];
  
  make_rho_prev_time(this);
  make_rho_curr_time(this);
  if (0 < avg_interval) {
    __new_size = (long)*(int *)&(((this->super_AmrLevel).parent)->super_AmrCore).super_AmrMesh.
                                super_AmrInfo.field_0x8c + 1;
    std::vector<double,_std::allocator<double>_>::resize
              (&time_avg.super_vector<double,_std::allocator<double>_>,__new_size);
    std::vector<double,_std::allocator<double>_>::resize
              (&time_avg_fluct.super_vector<double,_std::allocator<double>_>,__new_size);
    std::vector<double,_std::allocator<double>_>::resize
              (&dt_avg.super_vector<double,_std::allocator<double>_>,__new_size);
    if (average_in_checkpoint == 0) {
      os_ = amrex::OutStream();
      amrex::Print::Print((Print *)&isp,os_);
      std::operator<<(local_1a0,"WARNING! Average not found in checkpoint file. Creating data");
      std::endl<char,std::char_traits<char>>(local_1a0);
      amrex::Print::~Print((Print *)&isp);
      time = amrex::StateData::curTime
                       ((this->super_AmrLevel).state.
                        super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                        super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      RVar3 = amrex::StateData::prevTime
                        ((this->super_AmrLevel).state.
                         super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                         super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                         _M_impl.super__Vector_impl_data._M_start);
      lVar4 = (long)Average_Type;
      pSVar2 = (this->super_AmrLevel).state.
               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
               super__Vector_impl_data._M_start;
      d = amrex::DescriptorList::operator[]
                    ((DescriptorList *)amrex::AmrLevel::desc_lst,Average_Type);
      amrex::StateData::define
                (pSVar2 + lVar4,&(this->super_AmrLevel).geom.domain,&(this->super_AmrLevel).grids,
                 &(this->super_AmrLevel).dmap,d,time,time - RVar3,
                 (this->super_AmrLevel).m_factory._M_t.
                 super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 (this->super_AmrLevel).state.
                 super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                 super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                 super__Vector_impl_data._M_start[Average_Type].new_data._M_t.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,0.0);
      amrex::StateData::allocOldData
                ((this->super_AmrLevel).state.
                 super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                 super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                 super__Vector_impl_data._M_start + Average_Type);
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 (this->super_AmrLevel).state.
                 super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                 super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                 super__Vector_impl_data._M_start[Average_Type].old_data._M_t.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,0.0);
      iVar1 = (this->super_AmrLevel).level;
      dt_avg.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [iVar1] = 0.0;
      time_avg.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [iVar1] = 0.0;
      time_avg_fluct.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [iVar1] = 0.0;
    }
    else {
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string
                ((string *)&file,(string *)&((this->super_AmrLevel).parent)->restart_chkfile);
      std::operator+(&File,&file,"/TimeAverage");
      fileCharPtr.super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      fileCharPtr.super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      fileCharPtr.super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      _isp = amrex::ParallelDescriptor::m_comm;
      amrex::ParallelDescriptor::ReadAndBcastFile(&File,&fileCharPtr,true,(MPI_Comm *)&isp);
      std::__cxx11::string::string
                ((string *)&fileCharPtrString,
                 fileCharPtr.super_vector<char,_std::allocator<char>_>.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_start,(allocator *)&isp);
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&isp,(string *)&fileCharPtrString,_S_in);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&isp,(string *)&line);
      std::istream::_M_extract<double>((double *)&isp);
      std::istream::_M_extract<double>((double *)&isp);
      dt_avg.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [(this->super_AmrLevel).level] = 0.0;
      std::__cxx11::istringstream::~istringstream((istringstream *)&isp);
      std::__cxx11::string::~string((string *)&fileCharPtrString);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)&fileCharPtr);
      std::__cxx11::string::~string((string *)&File);
      std::__cxx11::string::~string((string *)&file);
      std::__cxx11::string::~string((string *)&line);
    }
  }
  return;
}

Assistant:

void
NavierStokesBase::post_restart ()
{
    make_rho_prev_time();
    make_rho_curr_time();

  if (avg_interval > 0){

    const int   finest_level = parent->finestLevel();
    NavierStokesBase::time_avg.resize(finest_level+1);
    NavierStokesBase::time_avg_fluct.resize(finest_level+1);
    NavierStokesBase::dt_avg.resize(finest_level+1);

    //
    // We assume that if Average_Type is not present, we have just activated
    // the start of averaging
    //
    if ( average_in_checkpoint==0 )
    {
      Print()<<"WARNING! Average not found in checkpoint file. Creating data"
             <<std::endl;

      Real cur_time = state[State_Type].curTime();
      Real prev_time = state[State_Type].prevTime();
      Real dt = cur_time - prev_time;
      state[Average_Type].define(geom.Domain(), grids, dmap, desc_lst[Average_Type],
                               cur_time, dt, Factory());

      MultiFab& Savg   = get_new_data(Average_Type);
      Savg.setVal(0.);
      state[Average_Type].allocOldData();
      MultiFab& Savg_old   = get_old_data(Average_Type);
      Savg_old.setVal(0.);

      NavierStokesBase::dt_avg[level]   = 0;
      NavierStokesBase::time_avg[level] = 0;
      NavierStokesBase::time_avg_fluct[level] = 0;


    }else{
      //
      // If Average_Type data were found, this means that we need to recover the
      // value of time_average
      //
      std::string line;
      std::string file=parent->theRestartFile();

      std::string File(file + "/TimeAverage");
      Vector<char> fileCharPtr;
      ParallelDescriptor::ReadAndBcastFile(File, fileCharPtr);
      std::string fileCharPtrString(fileCharPtr.dataPtr());
      std::istringstream isp(fileCharPtrString, std::istringstream::in);

      // read in title line
      std::getline(isp, line);

      isp >> NavierStokesBase::time_avg[level];
      isp >> NavierStokesBase::time_avg_fluct[level];
      NavierStokesBase::dt_avg[level]   = 0;

    }
  }

// FIXME - should remove ifdef and use runtime parameter instead...
#ifdef AMREX_USE_TURBULENT_FORCING
  //
  // Initialize data structures used for homogenous isentropic forced turbulence.
  // Only need to do it once.
  if (level == 0)
      TurbulentForcing::init_turbulent_forcing(geom.ProbLoArray(),geom.ProbHiArray());
#endif

#ifdef AMREX_PARTICLES
    post_restart_particle ();
#endif
}